

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int tohex(lua_State *L)

{
  UB UVar1;
  int iVar2;
  UB UVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  size_t len;
  char cStack_21;
  char buf [8];
  
  UVar1 = barg(L,1);
  iVar2 = lua_type(L,2);
  UVar3 = 8;
  if (iVar2 == -1) {
    pcVar4 = "0123456789abcdef";
  }
  else {
    UVar3 = barg(L,2);
    pcVar4 = "0123456789abcdef";
    if ((int)UVar3 < 0) {
      pcVar4 = "0123456789ABCDEF";
    }
  }
  uVar5 = -UVar3;
  if (0 < (int)UVar3) {
    uVar5 = UVar3;
  }
  uVar6 = (ulong)uVar5;
  if (7 < (int)uVar5) {
    uVar6 = 8;
  }
  for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    buf[uVar6 - 1] = pcVar4[UVar1 & 0xf];
    UVar1 = UVar1 >> 4;
  }
  uVar5 = -UVar3;
  if (0 < (int)UVar3) {
    uVar5 = UVar3;
  }
  len = 8;
  if (uVar5 < 8) {
    len = (size_t)uVar5;
  }
  lua_pushlstring(L,buf,len);
  return 1;
}

Assistant:

static int tohex(lua_State*L){
UB b=barg(L,1);
int n=lua_isnone(L,2)?8:(int)barg(L,2);
const char*hexdigits="0123456789abcdef";
char buf[8];
int i;
if(n<0){n=-n;hexdigits="0123456789ABCDEF";}
if(n>8)n=8;
for(i=(int)n;--i>=0;){buf[i]=hexdigits[b&15];b>>=4;}
lua_pushlstring(L,buf,(size_t)n);
return 1;
}